

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> __thiscall
xemmai::t_parser::f_action(t_parser *this,size_t a_indent,t_node *a_target,bool a_assignable)

{
  undefined7 in_register_00000009;
  
  f_action(this,a_indent,
           (unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_> *)a_target,
           true);
  if ((long *)CONCAT71(in_register_00000009,a_assignable) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(in_register_00000009,a_assignable) + 8))();
  }
  return (__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
         )(__uniq_ptr_data<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<ast::t_node> f_action(size_t a_indent, ast::t_node* a_target, bool a_assignable)
	{
		return f_action(a_indent, std::unique_ptr<ast::t_node>(a_target), a_assignable);
	}